

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GLMRegressor::SerializeWithCachedSizes
          (GLMRegressor *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  GLMRegressor_PostEvaluationTransform GVar3;
  GLMRegressor_DoubleArray *value;
  RepeatedField<double> *this_00;
  double *a;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  GLMRegressor *this_local;
  
  local_20 = 0;
  uVar1 = weights_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = weights(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  iVar2 = offset_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_offset_cached_byte_size_);
    this_00 = offset(this);
    a = google::protobuf::RepeatedField<double>::data(this_00);
    iVar2 = offset_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(a,iVar2,output);
  }
  GVar3 = postevaluationtransform(this);
  if (GVar3 != GLMRegressor_PostEvaluationTransform_NoTransform) {
    GVar3 = postevaluationtransform(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(3,GVar3,output);
  }
  return;
}

Assistant:

void GLMRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GLMRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
  for (unsigned int i = 0, n = this->weights_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->weights(i), output);
  }

  // repeated double offset = 2;
  if (this->offset_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_offset_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->offset().data(), this->offset_size(), output);
  }

  // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->postevaluationtransform(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GLMRegressor)
}